

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_string.h
# Opt level: O0

void __thiscall ST::string::set(string *this,wchar_t *wstr,size_t size,utf_validation_t validation)

{
  size_t local_58;
  type local_48;
  utf_validation_t local_24;
  size_t sStack_20;
  utf_validation_t validation_local;
  size_t size_local;
  wchar_t *wstr_local;
  string *this_local;
  
  local_24 = validation;
  sStack_20 = size;
  size_local = (size_t)wstr;
  wstr_local = (wchar_t *)this;
  if (size == 0xffffffffffffffff) {
    if (wstr == (wchar_t *)0x0) {
      local_58 = 0;
    }
    else {
      local_58 = std::char_traits<wchar_t>::length(wstr);
    }
    sStack_20 = local_58;
  }
  wchar_to_utf8<wchar_t>(&local_48,(wchar_t *)size_local,sStack_20,local_24);
  buffer<char>::operator=(&this->m_buffer,&local_48);
  buffer<char>::~buffer(&local_48);
  return;
}

Assistant:

void set(const wchar_t *wstr, size_t size = ST_AUTO_SIZE,
                 utf_validation_t validation = ST_DEFAULT_VALIDATION)
        {
            if (size == ST_AUTO_SIZE)
                size = wstr ? std::char_traits<wchar_t>::length(wstr) : 0;
            m_buffer = wchar_to_utf8(wstr, size, validation);
        }